

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

nghttp2_stream *
nghttp2_session_open_stream
          (nghttp2_session *session,int32_t stream_id,uint8_t flags,
          nghttp2_priority_spec *pri_spec_in,nghttp2_stream_state initial_state,
          void *stream_user_data)

{
  nghttp2_mem *mem;
  uint64_t uVar1;
  uint32_t uVar2;
  uint8_t uVar3;
  int iVar4;
  nghttp2_stream *stream;
  nghttp2_stream *stream_00;
  nghttp2_stream *stream_01;
  byte bVar5;
  byte bVar6;
  nghttp2_priority_spec *local_60;
  nghttp2_priority_spec pri_spec_default;
  
  mem = &session->mem;
  stream = (nghttp2_stream *)nghttp2_map_find(&session->streams,stream_id);
  uVar2 = session->opt_flags;
  if (stream == (nghttp2_stream *)0x0) {
    stream_00 = (nghttp2_stream *)nghttp2_mem_malloc(mem,0xe0);
    if (stream_00 == (nghttp2_stream *)0x0) {
      return (nghttp2_stream *)0x0;
    }
  }
  else {
    if (stream->state != NGHTTP2_STREAM_IDLE) {
      __assert_fail("stream->state == NGHTTP2_STREAM_IDLE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x520,
                    "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                   );
    }
    if (((stream->flags & 0x10) == 0) && (iVar4 = nghttp2_stream_in_dep_tree(stream), iVar4 == 0)) {
      __assert_fail("(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) || nghttp2_stream_in_dep_tree(stream)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x522,
                    "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                   );
    }
    iVar4 = nghttp2_stream_in_dep_tree(stream);
    stream_00 = stream;
    if (iVar4 != 0) {
      if ((stream->flags & 0x10) != 0) {
        __assert_fail("!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x525,
                      "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                     );
      }
      nghttp2_session_detach_idle_stream(session,stream);
      iVar4 = nghttp2_stream_dep_remove(stream);
      if (iVar4 != 0) {
        return (nghttp2_stream *)0x0;
      }
      if ((session->pending_no_rfc7540_priorities == '\x01') &&
         (session->fallback_rfc7540_priorities == '\0')) {
        stream->flags = stream->flags | 0x10;
      }
    }
  }
  bVar5 = (byte)uVar2 & 0x40 | flags;
  uVar3 = session->pending_no_rfc7540_priorities;
  local_60 = pri_spec_in;
  if (((uVar3 == '\x01') && (session->fallback_rfc7540_priorities == '\0')) ||
     ((session->remote_settings).no_rfc7540_priorities == 1)) {
    if ((session->server != '\0') || ((session->remote_settings).no_rfc7540_priorities == 1)) {
      local_60 = &pri_spec_default;
      nghttp2_priority_spec_default_init(local_60);
      uVar3 = session->pending_no_rfc7540_priorities;
    }
    bVar6 = bVar5 | 0x10;
    if (uVar3 != '\x01') {
      bVar6 = bVar5;
    }
LAB_0047484b:
    stream_01 = (nghttp2_stream *)0x0;
    bVar5 = bVar6;
LAB_0047484d:
    bVar5 = initial_state == NGHTTP2_STREAM_RESERVED | bVar5;
    if (stream == (nghttp2_stream *)0x0) {
      nghttp2_stream_init(stream_00,stream_id,bVar5,initial_state,local_60->weight,
                          (session->remote_settings).initial_window_size,
                          (session->local_settings).initial_window_size,stream_user_data,mem);
      if ((session->pending_no_rfc7540_priorities == '\x01') &&
         (session->fallback_rfc7540_priorities == '\0')) {
        uVar1 = session->stream_seq;
        session->stream_seq = uVar1 + 1;
        stream_00->seq = uVar1;
      }
      iVar4 = nghttp2_map_insert(&session->streams,stream_id,stream_00);
      if (iVar4 != 0) {
        nghttp2_stream_free(stream_00);
        goto LAB_00474953;
      }
    }
    else {
      stream_00->flags = bVar5;
      stream_00->state = initial_state;
      stream_00->weight = local_60->weight;
      stream_00->stream_user_data = stream_user_data;
    }
    if (initial_state == NGHTTP2_STREAM_IDLE) {
      nghttp2_session_keep_idle_stream(session,stream_00);
    }
    else if (initial_state == NGHTTP2_STREAM_RESERVED) {
      if ((stream_id == 0) || (((session->server == '\0' ^ (byte)stream_id) & 1) != 0)) {
        nghttp2_stream_shutdown(stream_00,NGHTTP2_SHUT_WR);
        session->num_incoming_reserved_streams = session->num_incoming_reserved_streams + 1;
      }
      else {
        nghttp2_stream_shutdown(stream_00,NGHTTP2_SHUT_RD);
      }
    }
    else if ((stream_id == 0) || (((session->server == '\0' ^ (byte)stream_id) & 1) != 0)) {
      session->num_incoming_streams = session->num_incoming_streams + 1;
    }
    else {
      session->num_outgoing_streams = session->num_outgoing_streams + 1;
    }
    if ((stream_00->flags & 0x10) != 0) {
      return stream_00;
    }
    if (local_60->stream_id == 0) {
      stream_01 = &session->root;
    }
    if (stream_01 == (nghttp2_stream *)0x0) {
      __assert_fail("dep_stream",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                    ,0x5a8,
                    "nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *, int32_t, uint8_t, nghttp2_priority_spec *, nghttp2_stream_state, void *)"
                   );
    }
    if (local_60->exclusive == '\0') {
      nghttp2_stream_dep_add(stream_01,stream_00);
      return stream_00;
    }
    iVar4 = nghttp2_stream_dep_insert(stream_01,stream_00);
    if (iVar4 == 0) {
      return stream_00;
    }
  }
  else {
    bVar6 = bVar5;
    if (pri_spec_in->stream_id == 0) goto LAB_0047484b;
    stream_01 = (nghttp2_stream *)nghttp2_map_find(&session->streams,pri_spec_in->stream_id);
    if (stream_01 != (nghttp2_stream *)0x0) {
      iVar4 = nghttp2_stream_in_dep_tree(stream_01);
      if (iVar4 == 0) goto LAB_004749e5;
      goto LAB_0047484d;
    }
    iVar4 = session_detect_idle_stream(session,pri_spec_in->stream_id);
    if (iVar4 == 0) {
LAB_004749e5:
      local_60 = &pri_spec_default;
      nghttp2_priority_spec_default_init(local_60);
      goto LAB_0047484d;
    }
    nghttp2_priority_spec_default_init(&pri_spec_default);
    stream_01 = nghttp2_session_open_stream
                          (session,pri_spec_in->stream_id,'\0',&pri_spec_default,NGHTTP2_STREAM_IDLE
                           ,(void *)0x0);
    if (stream_01 != (nghttp2_stream *)0x0) goto LAB_0047484d;
    if (stream != (nghttp2_stream *)0x0) {
      return (nghttp2_stream *)0x0;
    }
LAB_00474953:
    nghttp2_mem_free(mem,stream_00);
  }
  return (nghttp2_stream *)0x0;
}

Assistant:

nghttp2_stream *nghttp2_session_open_stream(nghttp2_session *session,
                                            int32_t stream_id, uint8_t flags,
                                            nghttp2_priority_spec *pri_spec_in,
                                            nghttp2_stream_state initial_state,
                                            void *stream_user_data) {
  int rv;
  nghttp2_stream *stream;
  nghttp2_stream *dep_stream = NULL;
  int stream_alloc = 0;
  nghttp2_priority_spec pri_spec_default;
  nghttp2_priority_spec *pri_spec = pri_spec_in;
  nghttp2_mem *mem;

  mem = &session->mem;
  stream = nghttp2_session_get_stream_raw(session, stream_id);

  if (session->opt_flags &
      NGHTTP2_OPTMASK_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION) {
    flags |= NGHTTP2_STREAM_FLAG_NO_RFC9113_LEADING_AND_TRAILING_WS_VALIDATION;
  }

  if (stream) {
    assert(stream->state == NGHTTP2_STREAM_IDLE);
    assert((stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) ||
           nghttp2_stream_in_dep_tree(stream));

    if (nghttp2_stream_in_dep_tree(stream)) {
      assert(!(stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES));
      nghttp2_session_detach_idle_stream(session, stream);
      rv = nghttp2_stream_dep_remove(stream);
      if (rv != 0) {
        return NULL;
      }

      if (session_no_rfc7540_pri_no_fallback(session)) {
        stream->flags |= NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES;
      }
    }
  } else {
    stream = nghttp2_mem_malloc(mem, sizeof(nghttp2_stream));
    if (stream == NULL) {
      return NULL;
    }

    stream_alloc = 1;
  }

  if (session_no_rfc7540_pri_no_fallback(session) ||
      session->remote_settings.no_rfc7540_priorities == 1) {
    /* For client which has not received server
       SETTINGS_NO_RFC7540_PRIORITIES = 1, send a priority signal
       opportunistically. */
    if (session->server ||
        session->remote_settings.no_rfc7540_priorities == 1) {
      nghttp2_priority_spec_default_init(&pri_spec_default);
      pri_spec = &pri_spec_default;
    }

    if (session->pending_no_rfc7540_priorities == 1) {
      flags |= NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES;
    }
  } else if (pri_spec->stream_id != 0) {
    dep_stream = nghttp2_session_get_stream_raw(session, pri_spec->stream_id);

    if (!dep_stream &&
        session_detect_idle_stream(session, pri_spec->stream_id)) {
      /* Depends on idle stream, which does not exist in memory.
         Assign default priority for it. */
      nghttp2_priority_spec_default_init(&pri_spec_default);

      dep_stream = nghttp2_session_open_stream(
          session, pri_spec->stream_id, NGHTTP2_FLAG_NONE, &pri_spec_default,
          NGHTTP2_STREAM_IDLE, NULL);

      if (dep_stream == NULL) {
        if (stream_alloc) {
          nghttp2_mem_free(mem, stream);
        }

        return NULL;
      }
    } else if (!dep_stream || !nghttp2_stream_in_dep_tree(dep_stream)) {
      /* If dep_stream is not part of dependency tree, stream will get
         default priority.  This handles the case when
         pri_spec->stream_id == stream_id.  This happens because we
         don't check pri_spec->stream_id against new stream ID in
         nghttp2_submit_request.  This also handles the case when idle
         stream created by PRIORITY frame was opened.  Somehow we
         first remove the idle stream from dependency tree.  This is
         done to simplify code base, but ideally we should retain old
         dependency.  But I'm not sure this adds values. */
      nghttp2_priority_spec_default_init(&pri_spec_default);
      pri_spec = &pri_spec_default;
    }
  }

  if (initial_state == NGHTTP2_STREAM_RESERVED) {
    flags |= NGHTTP2_STREAM_FLAG_PUSH;
  }

  if (stream_alloc) {
    nghttp2_stream_init(stream, stream_id, flags, initial_state,
                        pri_spec->weight,
                        (int32_t)session->remote_settings.initial_window_size,
                        (int32_t)session->local_settings.initial_window_size,
                        stream_user_data, mem);

    if (session_no_rfc7540_pri_no_fallback(session)) {
      stream->seq = session->stream_seq++;
    }

    rv = nghttp2_map_insert(&session->streams, stream_id, stream);
    if (rv != 0) {
      nghttp2_stream_free(stream);
      nghttp2_mem_free(mem, stream);
      return NULL;
    }
  } else {
    stream->flags = flags;
    stream->state = initial_state;
    stream->weight = pri_spec->weight;
    stream->stream_user_data = stream_user_data;
  }

  switch (initial_state) {
  case NGHTTP2_STREAM_RESERVED:
    if (nghttp2_session_is_my_stream_id(session, stream_id)) {
      /* reserved (local) */
      nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_RD);
    } else {
      /* reserved (remote) */
      nghttp2_stream_shutdown(stream, NGHTTP2_SHUT_WR);
      ++session->num_incoming_reserved_streams;
    }
    /* Reserved stream does not count in the concurrent streams
       limit. That is one of the DOS vector. */
    break;
  case NGHTTP2_STREAM_IDLE:
    /* Idle stream does not count toward the concurrent streams limit.
       This is used as anchor node in dependency tree. */
    nghttp2_session_keep_idle_stream(session, stream);
    break;
  default:
    if (nghttp2_session_is_my_stream_id(session, stream_id)) {
      ++session->num_outgoing_streams;
    } else {
      ++session->num_incoming_streams;
    }
  }

  if (stream->flags & NGHTTP2_STREAM_FLAG_NO_RFC7540_PRIORITIES) {
    return stream;
  }

  if (pri_spec->stream_id == 0) {
    dep_stream = &session->root;
  }

  assert(dep_stream);

  if (pri_spec->exclusive) {
    rv = nghttp2_stream_dep_insert(dep_stream, stream);
    if (rv != 0) {
      return NULL;
    }
  } else {
    nghttp2_stream_dep_add(dep_stream, stream);
  }

  return stream;
}